

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsChartElement.cpp
# Opt level: O0

void __thiscall KDReports::ChartElement::ChartElement(ChartElement *this,QString *modelKey)

{
  bool bVar1;
  ChartElementPrivate *pCVar2;
  QAbstractItemModel *pQVar3;
  QString *modelKey_local;
  ChartElement *this_local;
  
  Element::Element(&this->super_Element);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__ChartElement_001c8168;
  pCVar2 = (ChartElementPrivate *)operator_new(0x28);
  ChartElementPrivate::ChartElementPrivate(pCVar2);
  QSharedDataPointer<KDReports::ChartElementPrivate>::QSharedDataPointer(&this->d,pCVar2);
  bVar1 = QString::isEmpty(modelKey);
  if (!bVar1) {
    pQVar3 = modelForKey(modelKey);
    pCVar2 = QSharedDataPointer<KDReports::ChartElementPrivate>::operator->(&this->d);
    pCVar2->m_tableModel = pQVar3;
  }
  return;
}

Assistant:

KDReports::ChartElement::ChartElement(const QString &modelKey)
    : d(new ChartElementPrivate)
{
    if (!modelKey.isEmpty())
        d->m_tableModel = KDReports::modelForKey(modelKey);
}